

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DriverListenerAdapter.h
# Opt level: O0

int __thiscall
aeron::DriverListenerAdapter<aeron::ClientConductor>::receiveMessages
          (DriverListenerAdapter<aeron::ClientConductor> *this)

{
  CopyBroadcastReceiver *this_00;
  int iVar1;
  anon_class_8_1_8991fb9c local_38;
  handler_t local_30;
  DriverListenerAdapter<aeron::ClientConductor> *local_10;
  DriverListenerAdapter<aeron::ClientConductor> *this_local;
  
  this_00 = this->m_broadcastReceiver;
  local_38.this = this;
  local_10 = this;
  std::function<void(int,aeron::concurrent::AtomicBuffer&,int,int)>::
  function<aeron::DriverListenerAdapter<aeron::ClientConductor>::receiveMessages()::_lambda(int,aeron::concurrent::AtomicBuffer&,int,int)_1_,void>
            ((function<void(int,aeron::concurrent::AtomicBuffer&,int,int)> *)&local_30,&local_38);
  iVar1 = concurrent::broadcast::CopyBroadcastReceiver::receive(this_00,&local_30);
  std::function<void_(int,_aeron::concurrent::AtomicBuffer_&,_int,_int)>::~function(&local_30);
  return iVar1;
}

Assistant:

int receiveMessages()
    {
        return m_broadcastReceiver.receive(
            [&](std::int32_t msgTypeId, AtomicBuffer& buffer, util::index_t offset, util::index_t length)
            {
                switch (msgTypeId)
                {
                    case ControlProtocolEvents::ON_PUBLICATION_READY:
                    {
                        const PublicationBuffersReadyFlyweight publicationReady(buffer, offset);

                        m_driverListener.onNewPublication(
                            publicationReady.streamId(),
                            publicationReady.sessionId(),
                            publicationReady.positionLimitCounterId(),
                            publicationReady.channelStatusIndicatorId(),
                            publicationReady.logFileName(),
                            publicationReady.correlationId(),
                            publicationReady.registrationId());
                        break;
                    }

                    case ControlProtocolEvents::ON_EXCLUSIVE_PUBLICATION_READY:
                    {
                        const PublicationBuffersReadyFlyweight publicationReady(buffer, offset);

                        m_driverListener.onNewExclusivePublication(
                            publicationReady.streamId(),
                            publicationReady.sessionId(),
                            publicationReady.positionLimitCounterId(),
                            publicationReady.channelStatusIndicatorId(),
                            publicationReady.logFileName(),
                            publicationReady.correlationId(),
                            publicationReady.registrationId());
                        break;
                    }

                    case ControlProtocolEvents::ON_SUBSCRIPTION_READY:
                    {
                        const SubscriptionReadyFlyweight subscriptionReady(buffer, offset);

                        m_driverListener.onSubscriptionReady(
                            subscriptionReady.correlationId(),
                            subscriptionReady.channelStatusIndicatorId());
                        break;
                    }

                    case ControlProtocolEvents::ON_AVAILABLE_IMAGE:
                    {
                        const ImageBuffersReadyFlyweight imageReady(buffer, offset);

                        m_driverListener.onAvailableImage(
                            imageReady.streamId(),
                            imageReady.sessionId(),
                            imageReady.logFileName(),
                            imageReady.sourceIdentity(),
                            imageReady.subscriberPositionId(),
                            imageReady.subscriberRegistrationId(),
                            imageReady.correlationId());
                        break;
                    }

                    case ControlProtocolEvents::ON_OPERATION_SUCCESS:
                    {
                        const OperationSucceededFlyweight operationSucceeded(buffer, offset);

                        m_driverListener.onOperationSuccess(operationSucceeded.correlationId());
                        break;
                    }

                    case ControlProtocolEvents::ON_UNAVAILABLE_IMAGE:
                    {
                        const ImageMessageFlyweight imageMessage(buffer, offset);

                        m_driverListener.onUnavailableImage(
                            imageMessage.streamId(),
                            imageMessage.correlationId(),
                            imageMessage.subscriptionRegistrationId());
                        break;
                    }

                    case ControlProtocolEvents::ON_ERROR:
                    {
                        const ErrorResponseFlyweight errorResponse(buffer, offset);

                        m_driverListener.onErrorResponse(
                            errorResponse.offendingCommandCorrelationId(),
                            errorResponse.errorCode(),
                            errorResponse.errorMessage());
                        break;
                    }

                    case ControlProtocolEvents::ON_COUNTER_READY:
                    {
                        const CounterUpdateFlyweight response(buffer, offset);

                        m_driverListener.onAvailableCounter(response.correlationId(), response.counterId());
                        break;
                    }

                    case ControlProtocolEvents::ON_UNAVAILABLE_COUNTER:
                    {
                        const CounterUpdateFlyweight response(buffer, offset);

                        m_driverListener.onUnavailableCounter(response.correlationId(), response.counterId());
                        break;
                    }

                    case ControlProtocolEvents::ON_CLIENT_TIMEOUT:
                    {
                        const ClientTimeoutFlyweight response(buffer, offset);

                        m_driverListener.onClientTimeout(response.clientId());
                        break;
                    }

                    default:
                        break;
                }
            });
    }